

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

iterator __thiscall
first_fit_heap<256UL>::free_list_container::first_free
          (free_list_container *this,size_t size,iterator *before)

{
  iterator iVar1;
  bool bVar2;
  iterator iVar3;
  free_list_container *__range2;
  iterator __begin0;
  iterator local_38;
  
  local_38.block = this->list;
  iVar3.block = (header_free *)0x0;
  while( true ) {
    iVar1.block = local_38.block;
    if (local_38.block == (header_free *)0x0) {
      return (iterator)(header_free *)0x0;
    }
    bVar2 = fits(this,local_38.block,size);
    if (bVar2) break;
    iterator::operator++(&local_38);
    iVar3.block = iVar1.block;
  }
  before->block = (header_free *)iVar3;
  return (iterator)iVar1.block;
}

Assistant:

iterator first_free(size_t size, iterator &before) const
        {
            iterator before_ = end();

            for (auto elem : *this) {
                if (fits(*elem, size)) {
                    before = before_;
                    return {elem};
                }
                before_ = iterator(elem);
            }

            return {};
        }